

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::computeDuObj(HModel *this,int phase)

{
  pointer piVar1;
  pointer pdVar2;
  pointer pdVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  this->objective = 0.0;
  piVar1 = (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->workValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->workDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = 0;
  uVar4 = (ulong)(uint)this->numTot;
  if (this->numTot < 1) {
    uVar4 = uVar5;
  }
  dVar6 = 0.0;
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    if (piVar1[uVar5] != 0) {
      dVar6 = dVar6 + pdVar2[uVar5] * pdVar3[uVar5];
      this->objective = dVar6;
    }
  }
  if (phase != 1) {
    this->objective = dVar6 - this->objOffset;
  }
  return;
}

Assistant:

void HModel::computeDuObj(int phase) {
    objective = 0;
    for (int i = 0; i < numTot; i++)
        if (nonbasicFlag[i]) objective += workValue[i] * workDual[i];
//    double sv_objective = objective;
    if (phase != 1) objective -= objOffset;
//    printf("Phase %1d: sv_objective = %g; objOffset = %g; Objective = %g\n", phase, sv_objective, objOffset, objective);
}